

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockReturnValueTest_DoubleReturnValue_TestShell::createTest
          (TEST_MockReturnValueTest_DoubleReturnValue_TestShell *this)

{
  Utest *this_00;
  TEST_MockReturnValueTest_DoubleReturnValue_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x285);
  TEST_MockReturnValueTest_DoubleReturnValue_Test::TEST_MockReturnValueTest_DoubleReturnValue_Test
            ((TEST_MockReturnValueTest_DoubleReturnValue_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, DoubleReturnValue)
{
    double expected_return_value = 7.8;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    DOUBLES_EQUAL(expected_return_value, actual_call.returnValue().getDoubleValue(), 0.05);
    DOUBLES_EQUAL(expected_return_value, actual_call.returnDoubleValue(), 0.05);
    DOUBLES_EQUAL(expected_return_value, mock().doubleReturnValue(), 0.05);
}